

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringStream.hpp
# Opt level: O1

void __thiscall
Qentem::StringStream<char16_t>::StringStream
          (StringStream<char16_t> *this,StringStream<char16_t> *stream)

{
  SizeT SVar1;
  char16_t *from;
  uint new_capacity;
  
  this->storage_ = (char16_t *)0x0;
  this->length_ = 0;
  this->capacity_ = 0;
  if (stream->length_ != 0) {
    allocate(this,stream->length_);
    from = stream->storage_;
    SVar1 = stream->length_;
    new_capacity = this->length_ + SVar1;
    if (this->capacity_ < new_capacity) {
      expand(this,new_capacity);
    }
    Memory::Copy<unsigned_int>(this->storage_ + this->length_,from,SVar1 * 2);
    this->length_ = new_capacity;
  }
  return;
}

Assistant:

StringStream(const StringStream &stream) {
        if (stream.Length() != 0) {
            allocate(stream.Length());
            write(stream.First(), stream.Length());
        }
    }